

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_data.hpp
# Opt level: O0

void duckdb::ArrowScalarBaseData<float,_float,_duckdb::ArrowScalarConverter>::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  bool bVar1;
  ArrowBuffer *this;
  TemplatedValidityMask<unsigned_long> *pTVar2;
  UnifiedVectorFormat *this_00;
  idx_t iVar3;
  long lVar4;
  UnifiedVectorFormat *in_RCX;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  long *in_RDI;
  float fVar5;
  idx_t result_idx;
  idx_t source_idx;
  idx_t i;
  float *result_data;
  float *data;
  ArrowBuffer *main_buffer;
  UnifiedVectorFormat format;
  idx_t size;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  ArrowBuffer *in_stack_ffffffffffffff20;
  TemplatedValidityMask<unsigned_long> *this_01;
  UnifiedVectorFormat *in_stack_ffffffffffffff30;
  idx_t in_stack_ffffffffffffff48;
  idx_t in_stack_ffffffffffffff50;
  UnifiedVectorFormat *in_stack_ffffffffffffff58;
  ArrowAppendData *in_stack_ffffffffffffff60;
  UnifiedVectorFormat *pUVar6;
  UnifiedVectorFormat local_78;
  long local_30;
  UnifiedVectorFormat *pUVar7;
  
  local_30 = (long)in_RCX - (long)in_RDX;
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff30);
  Vector::ToUnifiedFormat(in_RSI,(idx_t)in_RDX,in_RCX);
  AppendValidity(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48);
  this = ArrowAppendData::GetMainBuffer((ArrowAppendData *)0x1536396);
  ArrowBuffer::size(this);
  ArrowBuffer::resize(in_stack_ffffffffffffff20,
                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  pTVar2 = (TemplatedValidityMask<unsigned_long> *)UnifiedVectorFormat::GetData<float>(&local_78);
  this_01 = pTVar2;
  this_00 = (UnifiedVectorFormat *)ArrowBuffer::GetData<float>((ArrowBuffer *)0x15363f3);
  pUVar6 = this_00;
  pUVar7 = in_RDX;
  for (; in_RDX < in_RCX; in_RDX = (UnifiedVectorFormat *)((long)&in_RDX->sel + 1)) {
    iVar3 = SelectionVector::get_index(local_78.sel,(idx_t)in_RDX);
    lVar4 = (long)in_RDX + (*in_RDI - (long)pUVar7);
    bVar1 = ArrowScalarConverter::SkipNulls();
    if ((!bVar1) ||
       (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_01,(idx_t)this_00), bVar1)) {
      fVar5 = ArrowScalarConverter::Operation<float,float>
                        (*(float *)((long)&pTVar2->validity_mask + iVar3 * 4));
      *(float *)((long)&pUVar6->sel + lVar4 * 4) = fVar5;
    }
    else {
      ArrowScalarConverter::SetNull<float>((float *)((long)&pUVar6->sel + lVar4 * 4));
    }
  }
  *in_RDI = local_30 + *in_RDI;
  UnifiedVectorFormat::~UnifiedVectorFormat(this_00);
  return;
}

Assistant:

static void Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		D_ASSERT(to >= from);
		idx_t size = to - from;
		D_ASSERT(size <= input_size);
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);

		// append the validity mask
		AppendValidity(append_data, format, from, to);

		// append the main data
		auto &main_buffer = append_data.GetMainBuffer();
		main_buffer.resize(main_buffer.size() + sizeof(TGT) * size);
		auto data = UnifiedVectorFormat::GetData<SRC>(format);
		auto result_data = main_buffer.GetData<TGT>();

		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto result_idx = append_data.row_count + i - from;

			if (OP::SkipNulls() && !format.validity.RowIsValid(source_idx)) {
				OP::template SetNull<TGT>(result_data[result_idx]);
				continue;
			}
			result_data[result_idx] = OP::template Operation<TGT, SRC>(data[source_idx]);
		}
		append_data.row_count += size;
	}